

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadMetaDataItem(ColladaParser *this,StringMetaData *metadata)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined1 local_484 [8];
  aiString aistr;
  string camel_key_str;
  char *value_char;
  allocator local_41;
  string local_40 [8];
  string key_str;
  char *key_char;
  StringMetaData *metadata_local;
  ColladaParser *this_local;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  key_str.field_2._8_8_ = pcVar2;
  if (pcVar2 == (char *)0x0) {
    SkipElement(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar2,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pcVar2 = TestTextContent(this);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)(aistr.data + 0x3f8),local_40);
      ToCamelCase((string *)(aistr.data + 0x3f8));
      aiString::aiString((aiString *)local_484);
      aiString::Set((aiString *)local_484,pcVar2);
      std::
      map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
      ::emplace<std::__cxx11::string&,aiString&>
                ((map<std::__cxx11::string,aiString,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  *)metadata,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (aistr.data + 0x3f8),(aiString *)local_484);
      std::__cxx11::string::~string((string *)(aistr.data + 0x3f8));
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    TestClosing(this,pcVar2);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void ColladaParser::ReadMetaDataItem(StringMetaData &metadata)
{
    // Metadata such as created, keywords, subject etc
    const char* key_char = mReader->getNodeName();
    if (key_char != nullptr)
    {
        const std::string key_str(key_char);
        const char* value_char = TestTextContent();
        if (value_char != nullptr)
        {
            std::string camel_key_str = key_str;
            ToCamelCase(camel_key_str);
            aiString aistr;
            aistr.Set(value_char);
            metadata.emplace(camel_key_str, aistr);
        }
        TestClosing(key_str.c_str());
    }
    else
        SkipElement();
}